

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isorr_ce.c
# Opt level: O0

void test_read_format_isorr_ce(void)

{
  int iVar1;
  archive_entry *a_00;
  char *pcVar2;
  char *pcVar3;
  int i;
  int64_t offset;
  size_t size;
  void *p;
  archive *a;
  archive_entry *ae;
  char path3 [160];
  char path2 [160];
  char path1 [160];
  char *refname;
  archive *in_stack_fffffffffffffd88;
  archive *a_01;
  archive_entry **entry;
  archive_entry_conflict *paVar4;
  int64_t *piVar5;
  archive_entry *paVar6;
  archive *in_stack_fffffffffffffd90;
  size_t *psVar7;
  archive *in_stack_fffffffffffffd98;
  archive *in_stack_fffffffffffffda0;
  wchar_t line;
  char *in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde8;
  int iVar8;
  wchar_t in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  archive_entry *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  archive_vtable_conflict *in_stack_fffffffffffffe20;
  char local_148 [160];
  char local_a8 [160];
  char *local_8;
  
  local_8 = "test_read_format_iso_rockridge_ce.iso.Z";
  mkpath(local_a8,0x97);
  mkpath(local_148,0x98);
  mkpath(&stack0xfffffffffffffe18,0x99);
  extract_reference_file((char *)path2._112_8_);
  a_00 = (archive_entry *)archive_read_new();
  assertion_assert((char *)in_stack_fffffffffffffda0,
                   (wchar_t)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd88);
  archive_read_support_filter_all(in_stack_fffffffffffffd88);
  a_01 = (archive *)0x0;
  assertion_equal_int(in_stack_fffffffffffffda8,(wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                      (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                      (char *)0x1826ca,in_stack_fffffffffffffdc0);
  archive_read_support_format_all(a_01);
  assertion_equal_int(in_stack_fffffffffffffda8,(wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                      (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                      (char *)0x182705,in_stack_fffffffffffffdc0);
  archive_read_open_filename
            (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,
             (size_t)in_stack_fffffffffffffd90);
  entry = (archive_entry **)0x0;
  assertion_equal_int(in_stack_fffffffffffffda8,(wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                      (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                      (char *)0x18274d,in_stack_fffffffffffffdc0);
  for (iVar8 = 0; iVar8 < 8; iVar8 = iVar8 + 1) {
    archive_read_next_header(in_stack_fffffffffffffd90,entry);
    assertion_equal_int(in_stack_fffffffffffffda8,
                        (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                        (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                        (char *)0x1827a3,in_stack_fffffffffffffdc0);
    archive_entry_is_encrypted(in_stack_fffffffffffffe10);
    assertion_equal_int(in_stack_fffffffffffffda8,
                        (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                        (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                        (char *)0x1827df,in_stack_fffffffffffffdc0);
    archive_read_has_encrypted_entries(in_stack_fffffffffffffd98);
    paVar6 = a_00;
    assertion_equal_int(in_stack_fffffffffffffda8,
                        (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                        (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                        (longlong)a_00,(char *)0x182821,in_stack_fffffffffffffdc0);
    pcVar2 = archive_entry_pathname(paVar6);
    iVar1 = strcmp(".",pcVar2);
    if (iVar1 == 0) {
      archive_entry_filetype(in_stack_fffffffffffffe10);
      assertion_equal_int(in_stack_fffffffffffffda8,
                          (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                          (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                          (char *)0x182886,in_stack_fffffffffffffdc0);
      archive_entry_size(in_stack_fffffffffffffe10);
      assertion_equal_int(in_stack_fffffffffffffda8,
                          (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                          (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                          (char *)0x1828c4,in_stack_fffffffffffffdc0);
      archive_entry_mtime(in_stack_fffffffffffffe10);
      assertion_equal_int(in_stack_fffffffffffffda8,
                          (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                          (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                          (char *)0x182902,in_stack_fffffffffffffdc0);
      archive_entry_mtime_nsec(in_stack_fffffffffffffe10);
      paVar4 = (archive_entry_conflict *)0x0;
      assertion_equal_int(in_stack_fffffffffffffda8,
                          (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                          (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                          (char *)0x18293d,in_stack_fffffffffffffdc0);
      archive_entry_stat(paVar4);
      assertion_equal_int(in_stack_fffffffffffffda8,
                          (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                          (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                          (char *)0x18297c,in_stack_fffffffffffffdc0);
      archive_entry_uid(in_stack_fffffffffffffe10);
      piVar5 = (int64_t *)0x0;
      assertion_equal_int(in_stack_fffffffffffffda8,
                          (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                          (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                          (char *)0x1829ba,in_stack_fffffffffffffdc0);
      archive_read_data_block
                (in_stack_fffffffffffffda0,(void **)in_stack_fffffffffffffd98,
                 (size_t *)in_stack_fffffffffffffd90,piVar5);
      assertion_equal_int(in_stack_fffffffffffffda8,
                          (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                          (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                          (longlong)a_00,(char *)0x182a09,in_stack_fffffffffffffdc0);
      entry = (archive_entry **)0x0;
      assertion_equal_int(in_stack_fffffffffffffda8,
                          (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                          (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                          (char *)0x182a3d,in_stack_fffffffffffffdc0);
    }
    else {
      pcVar2 = archive_entry_pathname(paVar6);
      iVar1 = strcmp("dir",pcVar2);
      if (iVar1 == 0) {
        archive_entry_pathname(paVar6);
        in_stack_fffffffffffffd90 =
             (archive *)((ulong)in_stack_fffffffffffffd90 & 0xffffffff00000000);
        assertion_equal_string
                  (in_stack_fffffffffffffdb8,(wchar_t)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                   in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                   (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffdd0,(wchar_t)in_stack_fffffffffffffdd8);
        archive_entry_filetype(in_stack_fffffffffffffe10);
        assertion_equal_int(in_stack_fffffffffffffda8,
                            (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                            (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                            (char *)0x182af1,in_stack_fffffffffffffdc0);
        archive_entry_size(in_stack_fffffffffffffe10);
        assertion_equal_int(in_stack_fffffffffffffda8,
                            (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                            (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                            (char *)0x182b2f,in_stack_fffffffffffffdc0);
        archive_entry_mtime(in_stack_fffffffffffffe10);
        assertion_equal_int(in_stack_fffffffffffffda8,
                            (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                            (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                            (char *)0x182b6d,in_stack_fffffffffffffdc0);
        archive_entry_atime(in_stack_fffffffffffffe10);
        paVar4 = (archive_entry_conflict *)0x0;
        assertion_equal_int(in_stack_fffffffffffffda8,
                            (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                            (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                            (char *)0x182bab,in_stack_fffffffffffffdc0);
        archive_entry_stat(paVar4);
        assertion_equal_int(in_stack_fffffffffffffda8,
                            (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                            (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                            (char *)0x182bea,in_stack_fffffffffffffdc0);
        archive_entry_uid(in_stack_fffffffffffffe10);
        assertion_equal_int(in_stack_fffffffffffffda8,
                            (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                            (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                            (char *)0x182c28,in_stack_fffffffffffffdc0);
        archive_entry_gid(in_stack_fffffffffffffe10);
        entry = (archive_entry **)0x0;
        assertion_equal_int(in_stack_fffffffffffffda8,
                            (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                            (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,0,
                            (char *)0x182c66,in_stack_fffffffffffffdc0);
      }
      else {
        pcVar2 = local_a8;
        pcVar3 = archive_entry_pathname(paVar6);
        iVar1 = strcmp(pcVar2,pcVar3);
        if (iVar1 == 0) {
          in_stack_fffffffffffffdd8 = local_a8;
          archive_entry_pathname(paVar6);
          psVar7 = (size_t *)((ulong)in_stack_fffffffffffffd90 & 0xffffffff00000000);
          assertion_equal_string
                    (in_stack_fffffffffffffdb8,(wchar_t)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                     in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                     (char *)in_stack_fffffffffffffd98,(char *)psVar7,in_stack_fffffffffffffdd0,
                     (wchar_t)in_stack_fffffffffffffdd8);
          archive_entry_filetype(in_stack_fffffffffffffe10);
          assertion_equal_int(in_stack_fffffffffffffda8,
                              (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                              (longlong)in_stack_fffffffffffffd98,(char *)psVar7,0,(char *)0x182d30,
                              in_stack_fffffffffffffdc0);
          archive_entry_size(in_stack_fffffffffffffe10);
          piVar5 = (int64_t *)0x0;
          assertion_equal_int(in_stack_fffffffffffffda8,
                              (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                              (longlong)in_stack_fffffffffffffd98,(char *)psVar7,0,(char *)0x182d6e,
                              in_stack_fffffffffffffdc0);
          archive_read_data_block
                    (in_stack_fffffffffffffda0,(void **)in_stack_fffffffffffffd98,psVar7,piVar5);
          assertion_equal_int(in_stack_fffffffffffffda8,
                              (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                              (longlong)in_stack_fffffffffffffd98,(char *)psVar7,0,(char *)0x182db8,
                              in_stack_fffffffffffffdc0);
          assertion_equal_int(in_stack_fffffffffffffda8,
                              (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                              (longlong)in_stack_fffffffffffffd98,(char *)psVar7,0,(char *)0x182de8,
                              in_stack_fffffffffffffdc0);
          in_stack_fffffffffffffd90 = (archive *)0x2eb473;
          in_stack_fffffffffffffd98 = (archive *)0x0;
          assertion_equal_mem(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                              (void *)CONCAT44(iVar8,in_stack_fffffffffffffde8),pcVar2,
                              in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                              (size_t)in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,
                              in_stack_fffffffffffffe20);
          archive_entry_mtime(in_stack_fffffffffffffe10);
          assertion_equal_int(in_stack_fffffffffffffda8,
                              (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                              (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                              0,(char *)0x182e71,in_stack_fffffffffffffdc0);
          archive_entry_atime(in_stack_fffffffffffffe10);
          paVar4 = (archive_entry_conflict *)0x0;
          assertion_equal_int(in_stack_fffffffffffffda8,
                              (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                              (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                              0,(char *)0x182eaf,in_stack_fffffffffffffdc0);
          archive_entry_stat(paVar4);
          assertion_equal_int(in_stack_fffffffffffffda8,
                              (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                              (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                              0,(char *)0x182eee,in_stack_fffffffffffffdc0);
          archive_entry_uid(in_stack_fffffffffffffe10);
          assertion_equal_int(in_stack_fffffffffffffda8,
                              (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                              (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                              0,(char *)0x182f2c,in_stack_fffffffffffffdc0);
          archive_entry_gid(in_stack_fffffffffffffe10);
          entry = (archive_entry **)0x0;
          assertion_equal_int(in_stack_fffffffffffffda8,
                              (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                              (longlong)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                              0,(char *)0x182f6a,in_stack_fffffffffffffdc0);
        }
        else {
          in_stack_fffffffffffffdd0 = local_148;
          pcVar3 = archive_entry_pathname(paVar6);
          iVar1 = strcmp(in_stack_fffffffffffffdd0,pcVar3);
          if (iVar1 == 0) {
            archive_entry_pathname(paVar6);
            psVar7 = (size_t *)((ulong)in_stack_fffffffffffffd90 & 0xffffffff00000000);
            assertion_equal_string
                      (in_stack_fffffffffffffdb8,(wchar_t)((ulong)in_stack_fffffffffffffdb0 >> 0x20)
                       ,in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                       (char *)in_stack_fffffffffffffd98,(char *)psVar7,in_stack_fffffffffffffdd0,
                       (wchar_t)in_stack_fffffffffffffdd8);
            archive_entry_filetype(in_stack_fffffffffffffe10);
            assertion_equal_int(in_stack_fffffffffffffda8,
                                (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                (longlong)in_stack_fffffffffffffd98,(char *)psVar7,0,
                                (char *)0x183034,in_stack_fffffffffffffdc0);
            archive_entry_size(in_stack_fffffffffffffe10);
            piVar5 = (int64_t *)0x0;
            assertion_equal_int(in_stack_fffffffffffffda8,
                                (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                (longlong)in_stack_fffffffffffffd98,(char *)psVar7,0,
                                (char *)0x183072,in_stack_fffffffffffffdc0);
            archive_read_data_block
                      (in_stack_fffffffffffffda0,(void **)in_stack_fffffffffffffd98,psVar7,piVar5);
            assertion_equal_int(in_stack_fffffffffffffda8,
                                (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                (longlong)in_stack_fffffffffffffd98,(char *)psVar7,0,
                                (char *)0x1830bc,in_stack_fffffffffffffdc0);
            assertion_equal_int(in_stack_fffffffffffffda8,
                                (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                (longlong)in_stack_fffffffffffffd98,(char *)psVar7,0,
                                (char *)0x1830ec,in_stack_fffffffffffffdc0);
            in_stack_fffffffffffffd90 = (archive *)0x2eb473;
            in_stack_fffffffffffffd98 = (archive *)0x0;
            assertion_equal_mem(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                                (void *)CONCAT44(iVar8,in_stack_fffffffffffffde8),pcVar2,
                                in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                                (size_t)in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,
                                in_stack_fffffffffffffe20);
            archive_entry_mtime(in_stack_fffffffffffffe10);
            assertion_equal_int(in_stack_fffffffffffffda8,
                                (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                (longlong)in_stack_fffffffffffffd98,
                                (char *)in_stack_fffffffffffffd90,0,(char *)0x183175,
                                in_stack_fffffffffffffdc0);
            archive_entry_atime(in_stack_fffffffffffffe10);
            paVar4 = (archive_entry_conflict *)0x0;
            assertion_equal_int(in_stack_fffffffffffffda8,
                                (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                (longlong)in_stack_fffffffffffffd98,
                                (char *)in_stack_fffffffffffffd90,0,(char *)0x1831b3,
                                in_stack_fffffffffffffdc0);
            archive_entry_stat(paVar4);
            assertion_equal_int(in_stack_fffffffffffffda8,
                                (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                (longlong)in_stack_fffffffffffffd98,
                                (char *)in_stack_fffffffffffffd90,0,(char *)0x1831f2,
                                in_stack_fffffffffffffdc0);
            archive_entry_uid(in_stack_fffffffffffffe10);
            assertion_equal_int(in_stack_fffffffffffffda8,
                                (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                (longlong)in_stack_fffffffffffffd98,
                                (char *)in_stack_fffffffffffffd90,0,(char *)0x183230,
                                in_stack_fffffffffffffdc0);
            archive_entry_gid(in_stack_fffffffffffffe10);
            entry = (archive_entry **)0x0;
            assertion_equal_int(in_stack_fffffffffffffda8,
                                (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                (longlong)in_stack_fffffffffffffd98,
                                (char *)in_stack_fffffffffffffd90,0,(char *)0x18326e,
                                in_stack_fffffffffffffdc0);
          }
          else {
            in_stack_fffffffffffffdc0 = &stack0xfffffffffffffe18;
            pcVar3 = archive_entry_pathname(paVar6);
            iVar1 = strcmp(in_stack_fffffffffffffdc0,pcVar3);
            if (iVar1 == 0) {
              in_stack_fffffffffffffdb8 = &stack0xfffffffffffffe18;
              archive_entry_pathname(paVar6);
              psVar7 = (size_t *)((ulong)in_stack_fffffffffffffd90 & 0xffffffff00000000);
              assertion_equal_string
                        (in_stack_fffffffffffffdb8,
                         (wchar_t)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                         in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                         (char *)in_stack_fffffffffffffd98,(char *)psVar7,in_stack_fffffffffffffdd0,
                         (wchar_t)in_stack_fffffffffffffdd8);
              archive_entry_filetype(in_stack_fffffffffffffe10);
              assertion_equal_int(in_stack_fffffffffffffda8,
                                  (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                  (longlong)in_stack_fffffffffffffd98,(char *)psVar7,0,
                                  (char *)0x183338,in_stack_fffffffffffffdc0);
              archive_entry_size(in_stack_fffffffffffffe10);
              piVar5 = (int64_t *)0x0;
              assertion_equal_int(in_stack_fffffffffffffda8,
                                  (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                  (longlong)in_stack_fffffffffffffd98,(char *)psVar7,0,
                                  (char *)0x183376,in_stack_fffffffffffffdc0);
              archive_read_data_block
                        (in_stack_fffffffffffffda0,(void **)in_stack_fffffffffffffd98,psVar7,piVar5)
              ;
              assertion_equal_int(in_stack_fffffffffffffda8,
                                  (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                  (longlong)in_stack_fffffffffffffd98,(char *)psVar7,0,
                                  (char *)0x1833c0,in_stack_fffffffffffffdc0);
              assertion_equal_int(in_stack_fffffffffffffda8,
                                  (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                  (longlong)in_stack_fffffffffffffd98,(char *)psVar7,0,
                                  (char *)0x1833f0,in_stack_fffffffffffffdc0);
              in_stack_fffffffffffffd90 = (archive *)0x2eb473;
              in_stack_fffffffffffffd98 = (archive *)0x0;
              assertion_equal_mem(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                                  (void *)CONCAT44(iVar8,in_stack_fffffffffffffde8),pcVar2,
                                  in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                                  (size_t)in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,
                                  in_stack_fffffffffffffe20);
              archive_entry_mtime(in_stack_fffffffffffffe10);
              assertion_equal_int(in_stack_fffffffffffffda8,
                                  (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                  (longlong)in_stack_fffffffffffffd98,
                                  (char *)in_stack_fffffffffffffd90,0,(char *)0x183479,
                                  in_stack_fffffffffffffdc0);
              archive_entry_atime(in_stack_fffffffffffffe10);
              paVar4 = (archive_entry_conflict *)0x0;
              assertion_equal_int(in_stack_fffffffffffffda8,
                                  (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                  (longlong)in_stack_fffffffffffffd98,
                                  (char *)in_stack_fffffffffffffd90,0,(char *)0x1834b7,
                                  in_stack_fffffffffffffdc0);
              archive_entry_stat(paVar4);
              assertion_equal_int(in_stack_fffffffffffffda8,
                                  (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                  (longlong)in_stack_fffffffffffffd98,
                                  (char *)in_stack_fffffffffffffd90,0,(char *)0x1834f6,
                                  in_stack_fffffffffffffdc0);
              archive_entry_uid(in_stack_fffffffffffffe10);
              assertion_equal_int(in_stack_fffffffffffffda8,
                                  (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                  (longlong)in_stack_fffffffffffffd98,
                                  (char *)in_stack_fffffffffffffd90,0,(char *)0x183534,
                                  in_stack_fffffffffffffdc0);
              archive_entry_gid(in_stack_fffffffffffffe10);
              entry = (archive_entry **)0x0;
              assertion_equal_int(in_stack_fffffffffffffda8,
                                  (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                  (longlong)in_stack_fffffffffffffd98,
                                  (char *)in_stack_fffffffffffffd90,0,(char *)0x183572,
                                  in_stack_fffffffffffffdc0);
            }
            else {
              pcVar2 = archive_entry_pathname(paVar6);
              iVar1 = strcmp("sym1",pcVar2);
              if (iVar1 == 0) {
                archive_entry_filetype(in_stack_fffffffffffffe10);
                paVar6 = (archive_entry *)0x0;
                assertion_equal_int(in_stack_fffffffffffffda8,
                                    (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                    (longlong)in_stack_fffffffffffffd98,
                                    (char *)in_stack_fffffffffffffd90,0,(char *)0x1835dc,
                                    in_stack_fffffffffffffdc0);
                in_stack_fffffffffffffdb0 = local_a8;
                archive_entry_symlink(paVar6);
                in_stack_fffffffffffffd90 =
                     (archive *)((ulong)in_stack_fffffffffffffd90 & 0xffffffff00000000);
                assertion_equal_string
                          (in_stack_fffffffffffffdb8,
                           (wchar_t)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                           in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                           (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                           in_stack_fffffffffffffdd0,(wchar_t)in_stack_fffffffffffffdd8);
                archive_entry_size(in_stack_fffffffffffffe10);
                assertion_equal_int(in_stack_fffffffffffffda8,
                                    (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                    (longlong)in_stack_fffffffffffffd98,
                                    (char *)in_stack_fffffffffffffd90,0,(char *)0x18366c,
                                    in_stack_fffffffffffffdc0);
                archive_entry_mtime(in_stack_fffffffffffffe10);
                paVar4 = (archive_entry_conflict *)0x0;
                assertion_equal_int(in_stack_fffffffffffffda8,
                                    (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                    (longlong)in_stack_fffffffffffffd98,
                                    (char *)in_stack_fffffffffffffd90,0,(char *)0x1836aa,
                                    in_stack_fffffffffffffdc0);
                archive_entry_stat(paVar4);
                assertion_equal_int(in_stack_fffffffffffffda8,
                                    (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                    (longlong)in_stack_fffffffffffffd98,
                                    (char *)in_stack_fffffffffffffd90,0,(char *)0x1836e9,
                                    in_stack_fffffffffffffdc0);
                archive_entry_uid(in_stack_fffffffffffffe10);
                assertion_equal_int(in_stack_fffffffffffffda8,
                                    (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                    (longlong)in_stack_fffffffffffffd98,
                                    (char *)in_stack_fffffffffffffd90,0,(char *)0x183727,
                                    in_stack_fffffffffffffdc0);
                archive_entry_gid(in_stack_fffffffffffffe10);
                entry = (archive_entry **)0x0;
                assertion_equal_int(in_stack_fffffffffffffda8,
                                    (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                    (longlong)in_stack_fffffffffffffd98,
                                    (char *)in_stack_fffffffffffffd90,0,(char *)0x183765,
                                    in_stack_fffffffffffffdc0);
              }
              else {
                pcVar2 = archive_entry_pathname(paVar6);
                iVar1 = strcmp("sym2",pcVar2);
                if (iVar1 == 0) {
                  archive_entry_filetype(in_stack_fffffffffffffe10);
                  paVar6 = (archive_entry *)0x0;
                  assertion_equal_int(in_stack_fffffffffffffda8,
                                      (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                      (longlong)in_stack_fffffffffffffd98,
                                      (char *)in_stack_fffffffffffffd90,0,(char *)0x1837cf,
                                      in_stack_fffffffffffffdc0);
                  in_stack_fffffffffffffda8 = local_148;
                  archive_entry_symlink(paVar6);
                  in_stack_fffffffffffffd90 =
                       (archive *)((ulong)in_stack_fffffffffffffd90 & 0xffffffff00000000);
                  assertion_equal_string
                            (in_stack_fffffffffffffdb8,
                             (wchar_t)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                             in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                             (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                             in_stack_fffffffffffffdd0,(wchar_t)in_stack_fffffffffffffdd8);
                  archive_entry_size(in_stack_fffffffffffffe10);
                  assertion_equal_int(in_stack_fffffffffffffda8,
                                      (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                      (longlong)in_stack_fffffffffffffd98,
                                      (char *)in_stack_fffffffffffffd90,0,(char *)0x18385f,
                                      in_stack_fffffffffffffdc0);
                  archive_entry_mtime(in_stack_fffffffffffffe10);
                  paVar4 = (archive_entry_conflict *)0x0;
                  assertion_equal_int(in_stack_fffffffffffffda8,
                                      (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                      (longlong)in_stack_fffffffffffffd98,
                                      (char *)in_stack_fffffffffffffd90,0,(char *)0x18389d,
                                      in_stack_fffffffffffffdc0);
                  archive_entry_stat(paVar4);
                  assertion_equal_int(in_stack_fffffffffffffda8,
                                      (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                      (longlong)in_stack_fffffffffffffd98,
                                      (char *)in_stack_fffffffffffffd90,0,(char *)0x1838dc,
                                      in_stack_fffffffffffffdc0);
                  archive_entry_uid(in_stack_fffffffffffffe10);
                  assertion_equal_int(in_stack_fffffffffffffda8,
                                      (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                      (longlong)in_stack_fffffffffffffd98,
                                      (char *)in_stack_fffffffffffffd90,0,(char *)0x18391a,
                                      in_stack_fffffffffffffdc0);
                  archive_entry_gid(in_stack_fffffffffffffe10);
                  entry = (archive_entry **)0x0;
                  assertion_equal_int(in_stack_fffffffffffffda8,
                                      (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                      (longlong)in_stack_fffffffffffffd98,
                                      (char *)in_stack_fffffffffffffd90,0,(char *)0x183958,
                                      in_stack_fffffffffffffdc0);
                }
                else {
                  pcVar2 = archive_entry_pathname(paVar6);
                  iVar1 = strcmp("sym3",pcVar2);
                  if (iVar1 == 0) {
                    archive_entry_filetype(in_stack_fffffffffffffe10);
                    paVar6 = (archive_entry *)0x0;
                    assertion_equal_int(in_stack_fffffffffffffda8,
                                        (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                        (longlong)in_stack_fffffffffffffd98,
                                        (char *)in_stack_fffffffffffffd90,0,(char *)0x1839c2,
                                        in_stack_fffffffffffffdc0);
                    in_stack_fffffffffffffda0 = (archive *)&stack0xfffffffffffffe18;
                    archive_entry_symlink(paVar6);
                    in_stack_fffffffffffffd90 =
                         (archive *)((ulong)in_stack_fffffffffffffd90 & 0xffffffff00000000);
                    assertion_equal_string
                              (in_stack_fffffffffffffdb8,
                               (wchar_t)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                               in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                               (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                               in_stack_fffffffffffffdd0,(wchar_t)in_stack_fffffffffffffdd8);
                    archive_entry_size(in_stack_fffffffffffffe10);
                    assertion_equal_int(in_stack_fffffffffffffda8,
                                        (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                        (longlong)in_stack_fffffffffffffd98,
                                        (char *)in_stack_fffffffffffffd90,0,(char *)0x183a52,
                                        in_stack_fffffffffffffdc0);
                    archive_entry_mtime(in_stack_fffffffffffffe10);
                    paVar4 = (archive_entry_conflict *)0x0;
                    assertion_equal_int(in_stack_fffffffffffffda8,
                                        (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                        (longlong)in_stack_fffffffffffffd98,
                                        (char *)in_stack_fffffffffffffd90,0,(char *)0x183a90,
                                        in_stack_fffffffffffffdc0);
                    archive_entry_stat(paVar4);
                    assertion_equal_int(in_stack_fffffffffffffda8,
                                        (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                        (longlong)in_stack_fffffffffffffd98,
                                        (char *)in_stack_fffffffffffffd90,0,(char *)0x183acf,
                                        in_stack_fffffffffffffdc0);
                    archive_entry_uid(in_stack_fffffffffffffe10);
                    assertion_equal_int(in_stack_fffffffffffffda8,
                                        (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                        (longlong)in_stack_fffffffffffffd98,
                                        (char *)in_stack_fffffffffffffd90,0,(char *)0x183b0d,
                                        in_stack_fffffffffffffdc0);
                    archive_entry_gid(in_stack_fffffffffffffe10);
                    entry = (archive_entry **)0x0;
                    assertion_equal_int(in_stack_fffffffffffffda8,
                                        (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                        (longlong)in_stack_fffffffffffffd98,
                                        (char *)in_stack_fffffffffffffd90,0,(char *)0x183b4b,
                                        in_stack_fffffffffffffdc0);
                  }
                  else {
                    failure("Saw a file that shouldn\'t have been there");
                    archive_entry_pathname(paVar6);
                    entry = (archive_entry **)0x0;
                    in_stack_fffffffffffffd90 =
                         (archive *)((ulong)in_stack_fffffffffffffd90 & 0xffffffff00000000);
                    assertion_equal_string
                              (in_stack_fffffffffffffdb8,
                               (wchar_t)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                               in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                               (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                               in_stack_fffffffffffffdd0,(wchar_t)in_stack_fffffffffffffdd8);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  archive_read_next_header(in_stack_fffffffffffffd90,entry);
  iVar8 = 0;
  line = (wchar_t)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  assertion_equal_int(in_stack_fffffffffffffda8,line,(longlong)in_stack_fffffffffffffd98,
                      (char *)in_stack_fffffffffffffd90,0,(char *)0x183c0b,in_stack_fffffffffffffdc0
                     );
  archive_filter_code(in_stack_fffffffffffffd90,iVar8);
  assertion_equal_int(in_stack_fffffffffffffda8,line,(longlong)in_stack_fffffffffffffd98,
                      (char *)in_stack_fffffffffffffd90,0,(char *)0x183c4c,in_stack_fffffffffffffdc0
                     );
  archive_format((archive *)a_00);
  assertion_equal_int(in_stack_fffffffffffffda8,line,(longlong)in_stack_fffffffffffffd98,
                      (char *)in_stack_fffffffffffffd90,0,(char *)0x183c8b,in_stack_fffffffffffffdc0
                     );
  archive_read_close((archive *)0x183c98);
  assertion_equal_int(in_stack_fffffffffffffda8,line,(longlong)in_stack_fffffffffffffd98,
                      (char *)in_stack_fffffffffffffd90,(longlong)a_00,(char *)0x183cca,
                      in_stack_fffffffffffffdc0);
  archive_read_free((archive *)0x183cd7);
  assertion_equal_int(in_stack_fffffffffffffda8,line,(longlong)in_stack_fffffffffffffd98,
                      (char *)in_stack_fffffffffffffd90,0,(char *)0x183d05,in_stack_fffffffffffffdc0
                     );
  return;
}

Assistant:

DEFINE_TEST(test_read_format_isorr_ce)
{
	const char *refname = "test_read_format_iso_rockridge_ce.iso.Z";
	char path1[160];
	char path2[160];
	char path3[160];
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;
	int i;

	mkpath(path1, 151);
	mkpath(path2, 152);
	mkpath(path3, 153);
	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Retrieve each of the 8 files on the ISO image and
	 * verify that each one is what we expect. */
	for (i = 0; i < 8; ++i) {
		assertEqualInt(0, archive_read_next_header(a, &ae));
		
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		if (strcmp(".", archive_entry_pathname(ae)) == 0) {
			/* '.' root directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			/* Now, we read timestamp recorded by RRIP "TF". */
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(0, archive_entry_mtime_nsec(ae));
			/* Now, we read links recorded by RRIP "PX". */
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
		} else if (strcmp("dir", archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir", archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp(path1, archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString(path1, archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(4090, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello 151\n", 10);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp(path2, archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString(path2, archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(4090, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello 152\n", 10);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp(path3, archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString(path3, archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(4090, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello 153\n", 10);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("sym1", archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString(path1, archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("sym2", archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString(path2, archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("sym3", archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString(path3, archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else {
			failure("Saw a file that shouldn't have been there");
			assertEqualString(archive_entry_pathname(ae), "");
		}
	}

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}